

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server.cpp
# Opt level: O1

int __thiscall CSnapIDPool::NewID(CSnapIDPool *this)

{
  undefined4 uVar1;
  undefined4 uVar2;
  short sVar3;
  int64 iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  long lVar9;
  
  iVar4 = time_get();
  if (this->m_FirstTimed != -1) {
    iVar6 = this->m_Usage;
    iVar8 = this->m_FirstTimed;
    iVar7 = this->m_FirstFree;
    do {
      iVar5 = iVar8;
      iVar6 = iVar6 + -1;
      if (iVar4 <= this->m_aIDs[iVar5].m_Timeout) break;
      sVar3 = this->m_aIDs[iVar5].m_Next;
      iVar8 = (int)sVar3;
      this->m_aIDs[iVar5].m_Next = (short)iVar7;
      this->m_aIDs[iVar5].m_State = 0;
      this->m_FirstFree = iVar5;
      this->m_FirstTimed = iVar8;
      if (iVar8 == -1) {
        this->m_LastTimed = -1;
      }
      this->m_Usage = iVar6;
      iVar7 = iVar5;
    } while (sVar3 != -1);
  }
  iVar6 = this->m_FirstFree;
  lVar9 = (long)iVar6;
  dbg_assert_imp("/workspace/llm4binary/github/license_all_cmakelists_1510/TsFreddie[P]teeworlds/src/engine/server/server.cpp"
                 ,0x5a,(uint)(lVar9 != -1),"id error");
  if (lVar9 != -1) {
    this->m_FirstFree = (int)this->m_aIDs[this->m_FirstFree].m_Next;
    this->m_aIDs[lVar9].m_State = 1;
    uVar1 = this->m_Usage;
    uVar2 = this->m_InUsage;
    this->m_Usage = uVar1 + 1;
    this->m_InUsage = uVar2 + 1;
  }
  return iVar6;
}

Assistant:

int CSnapIDPool::NewID()
{
	int64 Now = time_get();

	// process timed ids
	while(m_FirstTimed != -1 && m_aIDs[m_FirstTimed].m_Timeout < Now)
		RemoveFirstTimeout();

	int ID = m_FirstFree;
	dbg_assert(ID != -1, "id error");
	if(ID == -1)
		return ID;
	m_FirstFree = m_aIDs[m_FirstFree].m_Next;
	m_aIDs[ID].m_State = 1;
	m_Usage++;
	m_InUsage++;
	return ID;
}